

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# infomessages.cpp
# Opt level: O0

void __thiscall
CInfoMessages::RenderFinishMsg(CInfoMessages *this,CInfoMsg *pInfoMsg,float x,float y)

{
  vec2 CursorPosition;
  CUI *pCVar1;
  ITextRender *pIVar2;
  IGraphics *pIVar3;
  long in_RSI;
  long in_FS_OFFSET;
  float in_XMM0_Da;
  float fVar4;
  float fVar5;
  float fVar6;
  float in_XMM1_Da;
  int Emote;
  float AdvanceID;
  float TimeW;
  float DiffW;
  float PlayerNameW;
  float FontSize;
  vec2 in_stack_000000a0;
  vec2 in_stack_000000a8;
  CQuadItem QuadItem;
  float in_stack_ffffffffffffff18;
  float in_stack_ffffffffffffff1c;
  CTextCursor *in_stack_ffffffffffffff20;
  vec4 *TextColor;
  undefined4 in_stack_ffffffffffffff48;
  float nx;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 uVar7;
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar8;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 in_stack_ffffffffffffff64;
  float local_6c;
  vector2_base<float> local_54;
  vector2_base<float> local_4c;
  vector4_base<float> local_44;
  vector4_base<float> local_34;
  vector2_base<float> local_24;
  anon_union_4_2_94730227_for_vector4_base<float>_1 in_stack_ffffffffffffffe4;
  CTeeRenderInfo *in_stack_ffffffffffffffe8;
  anon_union_4_2_94730017_for_vector4_base<float>_7 in_stack_fffffffffffffff0;
  uint uVar9;
  CRenderTools *this_00;
  
  this_00 = *(CRenderTools **)(in_FS_OFFSET + 0x28);
  fVar4 = CTextCursor::Width((CTextCursor *)(in_RSI + 0x10));
  pCVar1 = CComponent::UI((CComponent *)0x16be04);
  fVar5 = CUI::GetClientIDRectWidth(pCVar1,36.0);
  local_6c = in_XMM0_Da;
  if (*(int *)(in_RSI + 0x22c) != 0) {
    fVar6 = CTextCursor::Width((CTextCursor *)(in_RSI + 0x298));
    CTextCursor::MoveTo(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
                        in_stack_ffffffffffffff18);
    pIVar2 = CComponent::TextRender((CComponent *)0x16be94);
    (*(pIVar2->super_IInterface)._vptr_IInterface[0x10])
              (0x3f800000,pIVar2,in_RSI + 0x298,0,0xffffffff);
    local_6c = (in_XMM0_Da - fVar6) - 16.0;
  }
  fVar6 = CTextCursor::Width((CTextCursor *)(in_RSI + 0x230));
  CTextCursor::MoveTo(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18)
  ;
  pIVar2 = CComponent::TextRender((CComponent *)0x16bf30);
  nx = 1.0;
  (*(pIVar2->super_IInterface)._vptr_IInterface[0x10])(pIVar2,in_RSI + 0x230,0,0xffffffff);
  fVar6 = (local_6c - fVar6) + -62.0;
  pIVar3 = CComponent::Graphics((CComponent *)0x16bf85);
  uVar9 = g_pData->m_aImages[0x19].m_Id.m_Id;
  (*(pIVar3->super_IInterface)._vptr_IInterface[0x13])(pIVar3,(ulong)uVar9);
  pIVar3 = CComponent::Graphics((CComponent *)0x16bfc0);
  (*(pIVar3->super_IInterface)._vptr_IInterface[0x17])();
  TextColor = (vec4 *)&stack0xffffffffffffffe4;
  IGraphics::CQuadItem::CQuadItem((CQuadItem *)TextColor,fVar6,in_XMM1_Da,52.0,52.0);
  pIVar3 = CComponent::Graphics((CComponent *)0x16c002);
  (*(pIVar3->super_IInterface)._vptr_IInterface[0x1d])(pIVar3,TextColor,1);
  pIVar3 = CComponent::Graphics((CComponent *)0x16c025);
  (*(pIVar3->super_IInterface)._vptr_IInterface[0x18])();
  fVar4 = (fVar6 + -10.0) - (fVar4 + fVar5);
  pCVar1 = CComponent::UI((CComponent *)0x16c06c);
  uVar7 = *(undefined4 *)(in_RSI + 0x58);
  vector2_base<float>::vector2_base(&local_24,fVar4,in_XMM1_Da);
  aVar8 = *(anon_union_4_2_94730284_for_vector2_base<float>_1 *)(in_RSI + 8);
  vector4_base<float>::vector4_base(&local_34,nx,nx,nx,0.5);
  vector4_base<float>::vector4_base(&local_44,0.1,0.1,0.1,nx);
  CursorPosition.field_1 = in_stack_ffffffffffffff64;
  CursorPosition.field_0 = aVar8;
  CUI::DrawClientID((CUI *)CONCAT44(uVar7,in_stack_ffffffffffffff58),(float)((ulong)pCVar1 >> 0x20),
                    CursorPosition,(int)pCVar1,(vec4 *)CONCAT44(nx,in_stack_ffffffffffffff48),
                    TextColor);
  CTextCursor::MoveTo(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18)
  ;
  pIVar2 = CComponent::TextRender((CComponent *)0x16c14e);
  (*(pIVar2->super_IInterface)._vptr_IInterface[0x10])(0x3f800000,pIVar2,in_RSI + 0x10,0,0xffffffff)
  ;
  CComponent::RenderTools((CComponent *)0x16c1d4);
  CAnimState::GetIdle();
  vector2_base<float>::vector2_base(&local_4c,-1.0,0.0);
  vector2_base<float>::vector2_base(&local_54,fVar4 - 28.0,in_XMM1_Da + 28.0);
  CRenderTools::RenderTee
            (this_00,(CAnimState *)CONCAT44(uVar9,in_stack_fffffffffffffff0),
             in_stack_ffffffffffffffe8,(int)in_stack_ffffffffffffffe4,in_stack_000000a8,
             in_stack_000000a0);
  if (*(CRenderTools **)(in_FS_OFFSET + 0x28) == this_00) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CInfoMessages::RenderFinishMsg(CInfoMsg *pInfoMsg, float x, float y) const
{
	float FontSize = 36.0f;
	float PlayerNameW = pInfoMsg->m_Player1NameCursor.Width() + UI()->GetClientIDRectWidth(FontSize);
	
	// render diff
	if(pInfoMsg->m_Diff != 0)
	{
		float DiffW = pInfoMsg->m_DiffCursor.Width();

		x -= DiffW;

		pInfoMsg->m_DiffCursor.MoveTo(x, y);
		TextRender()->DrawTextOutlined(&pInfoMsg->m_DiffCursor);

		x -= 16.0f;
	}

	// render time
	float TimeW = pInfoMsg->m_TimeCursor.Width();
	x -= TimeW;
	pInfoMsg->m_TimeCursor.MoveTo(x, y);
	TextRender()->DrawTextOutlined(&pInfoMsg->m_TimeCursor);
	x -= 52.0f + 10.0f;

	// render flag
	Graphics()->TextureSet(g_pData->m_aImages[IMAGE_RACEFLAG].m_Id);
	Graphics()->QuadsBegin();
	IGraphics::CQuadItem QuadItem(x, y, 52, 52);
	Graphics()->QuadsDrawTL(&QuadItem, 1);
	Graphics()->QuadsEnd();

	x -= 10.0f;

	// render player name
	x -= PlayerNameW;

	float AdvanceID = UI()->DrawClientID(pInfoMsg->m_Player1NameCursor.m_FontSize, vec2(x, y), pInfoMsg->m_Player1ID);
	pInfoMsg->m_Player1NameCursor.MoveTo(x + AdvanceID, y);
	TextRender()->DrawTextOutlined(&pInfoMsg->m_Player1NameCursor);

	x -= 28.0f;

	// render player tee
	int Emote = (pInfoMsg->m_RecordPersonal || pInfoMsg->m_RecordServer) ? EMOTE_HAPPY : EMOTE_NORMAL;
	RenderTools()->RenderTee(CAnimState::GetIdle(), &pInfoMsg->m_Player1RenderInfo, Emote, vec2(-1,0), vec2(x, y+28));
}